

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> *_ph,string *_name)

{
  uint in_EAX;
  BasePropHandleT<OpenMesh::Attributes::StatusInfo> BVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  BVar1 = PropertyContainer::add<OpenMesh::Attributes::StatusInfo>
                    (&this->hprops_,(StatusInfo *)((long)&uStack_28 + 4),_name);
  (_ph->super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>).super_BaseHandle.idx_ =
       (int)BVar1.super_BaseHandle.idx_;
  iVar2 = (*this->_vptr_BaseKernel[3])(this);
  PropertyContainer::resize(&this->hprops_,CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void add_property( HPropHandleT<T>& _ph, const std::string& _name="<hprop>")
  {
    _ph = HPropHandleT<T>( hprops_.add(T(), _name) );
    hprops_.resize(n_halfedges());
  }